

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void expr_emit_neg(Parser *psr,Node *operand)

{
  byte bVar1;
  BcIns ins_00;
  int iVar2;
  Function *fn;
  int idx;
  BcIns ins;
  uint8_t slot;
  Node *operand_local;
  Parser *psr_local;
  
  if (operand->type == NODE_NUM) {
    operand->field_1 = (anon_union_8_6_f630ca3c_for_Node_1)(operand->field_1 ^ 0x8000000000000000);
  }
  else {
    if (operand->type == NODE_PRIM) {
      psr_trigger_err(psr,"invalid operand to unary operator");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x40e,"void expr_emit_neg(Parser *, Node *)");
    }
    bVar1 = expr_to_any_slot(psr,operand);
    expr_free_node(psr,operand);
    ins_00 = bc_new2(BC_NEG,'\0',(ushort)bVar1);
    fn = psr_fn(psr);
    iVar2 = fn_emit(fn,ins_00);
    operand->type = NODE_RELOC;
    (operand->field_1).reloc_idx = iVar2;
  }
  return;
}

Assistant:

static void expr_emit_neg(Parser *psr, Node *operand) {
	// Check if we can fold the operation
	if (operand->type == NODE_NUM) {
		operand->num = -operand->num;
		return;
	} else if (operand->type == NODE_PRIM) {
		// Invalid operand
		psr_trigger_err(psr, "invalid operand to unary operator");
		UNREACHABLE();
	}

	// Convert the operand to a stack slot that we can negate (since BC_NEG
	// only operates on stack slots)
	uint8_t slot = expr_to_any_slot(psr, operand);

	// Free the operand if it's on top of the stack, so we can re-use its slot
	expr_free_node(psr, operand);

	// Generate a relocatable instruction
	BcIns ins = bc_new2(BC_NEG, 0, slot);
	int idx = fn_emit(psr_fn(psr), ins);

	// The result of the negation is a relocatable instruction
	operand->type = NODE_RELOC;
	operand->reloc_idx = idx;
}